

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_tt__rasterize_sorted_edges
               (nk_tt__bitmap *result,nk_tt__edge *e,int n,int vsubsample,int off_x,int off_y,
               nk_allocator *alloc)

{
  float *ptr;
  nk_tt__active_edge *pnVar1;
  float y_top;
  float local_2c4;
  nk_tt__active_edge *z_2;
  int m;
  float k;
  float sum;
  nk_tt__active_edge *z_1;
  nk_tt__active_edge *z;
  nk_tt__active_edge **step;
  float scan_y_bottom;
  float scan_y_top;
  float *scanline2;
  float *scanline;
  float scanline_data [129];
  int local_6c;
  int local_68;
  int i;
  int j;
  int y;
  nk_tt__active_edge *active;
  nk_tt__hheap hh;
  int off_y_local;
  int off_x_local;
  int vsubsample_local;
  int n_local;
  nk_tt__edge *e_local;
  nk_tt__bitmap *result_local;
  
  _j = (nk_tt__active_edge *)0x0;
  local_68 = 0;
  hh.num_remaining_in_head_chunk = off_y;
  hh._44_4_ = off_x;
  nk_zero(&active,0x30);
  active = (nk_tt__active_edge *)(alloc->userdata).ptr;
  hh.alloc.userdata = (nk_handle)alloc->alloc;
  hh.alloc.alloc = (nk_plugin_alloc)alloc->free;
  if (result->w < 0x41) {
    scanline2 = (float *)&scanline;
  }
  else {
    scanline2 = (float *)(*alloc->alloc)(alloc->userdata,(void *)0x0,(long)(result->w * 2 + 1) << 2)
    ;
  }
  ptr = scanline2 + result->w;
  i = hh.num_remaining_in_head_chunk;
  e[n].y0 = (float)(hh.num_remaining_in_head_chunk + result->h) + 1.0;
  _vsubsample_local = e;
  do {
    if (result->h <= local_68) {
      nk_tt__hheap_cleanup((nk_tt__hheap *)&active);
      if ((float **)scanline2 != &scanline) {
        (*alloc->free)(alloc->userdata,scanline2);
      }
      return;
    }
    y_top = (float)i + 0.0;
    z = (nk_tt__active_edge *)&j;
    nk_memset(scanline2,0,(long)result->w << 2);
    nk_memset(ptr,0,(long)(result->w + 1) << 2);
    while (z->next != (nk_tt__active_edge *)0x0) {
      pnVar1 = z->next;
      if (y_top < pnVar1->ey) {
        z = z->next;
      }
      else {
        z->next = pnVar1->next;
        if ((pnVar1->direction == 0.0) && (!NAN(pnVar1->direction))) {
          __assert_fail("z->direction",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                        ,0x23e9,
                        "void nk_tt__rasterize_sorted_edges(struct nk_tt__bitmap *, struct nk_tt__edge *, int, int, int, int, struct nk_allocator *)"
                       );
        }
        pnVar1->direction = 0.0;
        nk_tt__hheap_free((nk_tt__hheap *)&active,pnVar1);
      }
    }
    for (; _vsubsample_local->y0 <= (float)i + 1.0; _vsubsample_local = _vsubsample_local + 1) {
      if (((_vsubsample_local->y0 != _vsubsample_local->y1) ||
          (NAN(_vsubsample_local->y0) || NAN(_vsubsample_local->y1))) &&
         (pnVar1 = nk_tt__new_active((nk_tt__hheap *)&active,_vsubsample_local,hh._44_4_,y_top),
         pnVar1 != (nk_tt__active_edge *)0x0)) {
        if (pnVar1->ey < y_top) {
          __assert_fail("z->ey >= scan_y_top",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                        ,0x23f6,
                        "void nk_tt__rasterize_sorted_edges(struct nk_tt__bitmap *, struct nk_tt__edge *, int, int, int, int, struct nk_allocator *)"
                       );
        }
        pnVar1->next = _j;
        _j = pnVar1;
      }
    }
    if (_j != (nk_tt__active_edge *)0x0) {
      nk_tt__fill_active_edges_new(scanline2,ptr + 1,result->w,_j,y_top);
    }
    m = 0;
    for (local_6c = 0; local_6c < result->w; local_6c = local_6c + 1) {
      m = (int)(ptr[local_6c] + (float)m);
      local_2c4 = scanline2[local_6c] + (float)m;
      if (local_2c4 < 0.0) {
        local_2c4 = -local_2c4;
      }
      z_2._4_4_ = (int)(local_2c4 * 255.0 + 0.5);
      if (0xff < z_2._4_4_) {
        z_2._4_4_ = 0xff;
      }
      result->pixels[local_68 * result->stride + local_6c] = (uchar)z_2._4_4_;
    }
    for (z = (nk_tt__active_edge *)&j; z->next != (nk_tt__active_edge *)0x0; z = z->next) {
      pnVar1 = z->next;
      pnVar1->fx = pnVar1->fdx + pnVar1->fx;
    }
    i = i + 1;
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

NK_INTERN void
nk_tt__rasterize_sorted_edges(struct nk_tt__bitmap *result, struct nk_tt__edge *e,
    int n, int vsubsample, int off_x, int off_y, struct nk_allocator *alloc)
{
    struct nk_tt__hheap hh;
    struct nk_tt__active_edge *active = 0;
    int y,j=0, i;
    float scanline_data[129], *scanline, *scanline2;

    NK_UNUSED(vsubsample);
    nk_zero_struct(hh);
    hh.alloc = *alloc;

    if (result->w > 64)
        scanline = (float *) alloc->alloc(alloc->userdata,0, (nk_size)(result->w*2+1) * sizeof(float));
    else scanline = scanline_data;

    scanline2 = scanline + result->w;
    y = off_y;
    e[n].y0 = (float) (off_y + result->h) + 1;

    while (j < result->h)
    {
        /* find center of pixel for this scanline */
        float scan_y_top    = (float)y + 0.0f;
        float scan_y_bottom = (float)y + 1.0f;
        struct nk_tt__active_edge **step = &active;

        NK_MEMSET(scanline , 0, (nk_size)result->w*sizeof(scanline[0]));
        NK_MEMSET(scanline2, 0, (nk_size)(result->w+1)*sizeof(scanline[0]));

        /* update all active edges; */
        /* remove all active edges that terminate before the top of this scanline */
        while (*step) {
            struct nk_tt__active_edge * z = *step;
            if (z->ey <= scan_y_top) {
                *step = z->next; /* delete from list */
                NK_ASSERT(z->direction);
                z->direction = 0;
                nk_tt__hheap_free(&hh, z);
            } else {
                step = &((*step)->next); /* advance through list */
            }
        }

        /* insert all edges that start before the bottom of this scanline */
        while (e->y0 <= scan_y_bottom) {
            if (e->y0 != e->y1) {
                struct nk_tt__active_edge *z = nk_tt__new_active(&hh, e, off_x, scan_y_top);
                if (z != 0) {
                    NK_ASSERT(z->ey >= scan_y_top);
                    /* insert at front */
                    z->next = active;
                    active = z;
                }
            }
            ++e;
        }

        /* now process all active edges */
        if (active)
            nk_tt__fill_active_edges_new(scanline, scanline2+1, result->w, active, scan_y_top);

        {
            float sum = 0;
            for (i=0; i < result->w; ++i) {
                float k;
                int m;
                sum += scanline2[i];
                k = scanline[i] + sum;
                k = (float) NK_ABS(k) * 255.0f + 0.5f;
                m = (int) k;
                if (m > 255) m = 255;
                result->pixels[j*result->stride + i] = (unsigned char) m;
            }
        }
        /* advance all the edges */
        step = &active;
        while (*step) {
            struct nk_tt__active_edge *z = *step;
            z->fx += z->fdx; /* advance to position for current scanline */
            step = &((*step)->next); /* advance through list */
        }
        ++y;
        ++j;
    }
    nk_tt__hheap_cleanup(&hh);
    if (scanline != scanline_data)
        alloc->free(alloc->userdata, scanline);
}